

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O2

void __thiscall
tcu::x11::egl::DisplayFactory::DisplayFactory(DisplayFactory *this,EventState *eventState)

{
  WindowFactory *this_00;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"x11",&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Native X11 Display",&local_5a);
  eglu::NativeDisplayFactory::NativeDisplayFactory
            (&this->super_NativeDisplayFactory,&local_38,&local_58,
             CAPABILITY_GET_DISPLAY_PLATFORM|CAPABILITY_GET_DISPLAY_LEGACY,0x31d6,
             "EGL_EXT_platform_x11");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_NativeDisplayFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__NativeDisplayFactory_00bf3010;
  this->m_eventState = eventState;
  this_00 = (WindowFactory *)operator_new(0x50);
  WindowFactory::WindowFactory(this_00);
  GenericFactoryRegistry::registerFactory
            (&(this->super_NativeDisplayFactory).m_nativeWindowRegistry.m_registry,
             (AbstractFactory *)this_00);
  return;
}

Assistant:

DisplayFactory::DisplayFactory (EventState& eventState)
	: NativeDisplayFactory	("x11", "Native X11 Display",
							 Display::CAPABILITIES,
							 EGL_PLATFORM_X11_SCREEN_EXT,
							 "EGL_EXT_platform_x11")
	, m_eventState			(eventState)
{
	m_nativeWindowRegistry.registerFactory(new WindowFactory());
	// m_nativePixmapRegistry.registerFactory(new PixmapFactory());
}